

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGenerator::CheckTargetsForPchCompilePdb(cmGlobalGenerator *this)

{
  cmLocalGenerator *pcVar1;
  pointer puVar2;
  __uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true> _Var3;
  size_t __n;
  cmake *this_00;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  cmValue cVar8;
  string *psVar9;
  string *psVar10;
  char *extraout_RDX;
  pointer puVar11;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string e;
  undefined1 local_120 [32];
  _Alloc_hider local_100;
  size_type local_f8;
  undefined1 local_f0 [16];
  _Rb_tree_impl<std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
  local_e0;
  undefined1 local_b0 [8];
  string local_a8;
  pointer local_88;
  pointer local_80;
  cmGlobalGenerator *local_78;
  undefined1 local_70 [32];
  string local_50;
  
  local_120._0_8_ = local_120 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"C","");
  bVar4 = cmState::GetLanguageEnabled
                    ((this->CMakeInstance->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_120);
  if (bVar4) {
    bVar4 = false;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CXX","");
    bVar4 = cmState::GetLanguageEnabled
                      ((this->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_50);
    bVar4 = !bVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  if (!bVar4) {
    local_80 = (this->LocalGenerators).
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_88 = (this->LocalGenerators).
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_80 != local_88) {
      bVar4 = false;
      local_78 = this;
      do {
        pcVar1 = (local_80->_M_t).
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                 super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
        puVar2 = *(pointer *)
                  ((long)&(pcVar1->GeneratorTargets).
                          super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                  + 8);
        for (puVar11 = *(pointer *)
                        &(pcVar1->GeneratorTargets).
                         super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                         ._M_impl; puVar11 != puVar2; puVar11 = puVar11 + 1) {
          bVar5 = cmGeneratorTarget::CanCompileSources
                            ((cmGeneratorTarget *)
                             (puVar11->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            );
          bVar6 = true;
          if (bVar5) {
            _Var3.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
            _M_t.
            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
            super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                 (puVar11->_M_t).
                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>;
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"ghs_integrity_app","");
            cVar8 = cmGeneratorTarget::GetProperty
                              ((cmGeneratorTarget *)
                               _Var3.
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                               .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                               &local_a8);
            if (cVar8.Value == (string *)0x0) {
              bVar6 = false;
            }
            else {
              value._M_str = extraout_RDX;
              value._M_len = (size_t)((cVar8.Value)->_M_dataplus)._M_p;
              bVar6 = cmValue::IsOn((cmValue *)(cVar8.Value)->_M_string_length,value);
            }
          }
          if ((bVar5) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2)) {
            operator_delete(local_a8._M_dataplus._M_p,
                            (ulong)(local_a8.field_2._M_allocated_capacity + 1));
          }
          if (bVar6 == false) {
            _Var3.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
            _M_t.
            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
            super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                 (puVar11->_M_t).
                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>;
            local_120._0_8_ = local_120 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_120,"PRECOMPILE_HEADERS_REUSE_FROM","");
            psVar9 = cmGeneratorTarget::GetSafeProperty
                               ((cmGeneratorTarget *)
                                _Var3.
                                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                                (string *)local_120);
            if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
              operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
            }
            _Var3.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
            _M_t.
            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
            super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                 (puVar11->_M_t).
                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>;
            local_120._0_8_ = local_120 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_120,"COMPILE_PDB_NAME","");
            psVar10 = cmGeneratorTarget::GetSafeProperty
                                ((cmGeneratorTarget *)
                                 _Var3.
                                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                 .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                                 (string *)local_120);
            if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
              operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
            }
            __n = psVar9->_M_string_length;
            if ((__n != 0) &&
               ((__n != psVar10->_M_string_length ||
                (iVar7 = bcmp((psVar9->_M_dataplus)._M_p,(psVar10->_M_dataplus)._M_p,__n),
                iVar7 != 0)))) {
              psVar10 = cmGeneratorTarget::GetName_abi_cxx11_
                                  ((cmGeneratorTarget *)
                                   (puVar11->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                  );
              local_120._0_8_ = (pointer)0x3a;
              local_120._8_8_ = "PRECOMPILE_HEADERS_REUSE_FROM property is set on target (\"";
              local_120._16_8_ = 0;
              local_100._M_p = (psVar10->_M_dataplus)._M_p;
              local_120._24_8_ = psVar10->_M_string_length;
              local_f8 = 0;
              local_f0._0_8_ = 0x5a;
              local_f0._8_8_ =
                   "\"). Reusable precompile headers requires the COMPILE_PDB_NAME property to have the value \""
              ;
              local_e0._0_8_ = 0;
              local_e0.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)(psVar9->_M_dataplus)._M_p;
              local_e0.super__Rb_tree_header._M_header._0_8_ = psVar9->_M_string_length;
              local_e0.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
              local_e0.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x2;
              local_e0.super__Rb_tree_header._M_node_count = 0x974613;
              local_b0 = (undefined1  [8])0x0;
              views._M_len = 5;
              views._M_array = (iterator)local_120;
              cmCatViews((string *)local_70,views);
              this_00 = local_78->CMakeInstance;
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_120);
              cmake::IssueMessage(this_00,FATAL_ERROR,(string *)local_70,
                                  (cmListFileBacktrace *)local_120);
              if ((cmMakefile *)local_120._8_8_ != (cmMakefile *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_);
              }
              if ((_Base_ptr)local_70._0_8_ != (_Base_ptr)(local_70 + 0x10)) {
                operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
              }
              bVar4 = true;
            }
          }
        }
        local_80 = local_80 + 1;
      } while (local_80 != local_88);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool cmGlobalGenerator::CheckTargetsForPchCompilePdb() const
{
  if (!this->GetLanguageEnabled("C") && !this->GetLanguageEnabled("CXX")) {
    return false;
  }
  bool failed = false;
  for (const auto& generator : this->LocalGenerators) {
    for (const auto& target : generator->GetGeneratorTargets()) {
      if (!target->CanCompileSources() ||
          target->GetProperty("ghs_integrity_app").IsOn()) {
        continue;
      }

      std::string const& reuseFrom =
        target->GetSafeProperty("PRECOMPILE_HEADERS_REUSE_FROM");
      std::string const& compilePdb =
        target->GetSafeProperty("COMPILE_PDB_NAME");

      if (!reuseFrom.empty() && reuseFrom != compilePdb) {
        const std::string e = cmStrCat(
          "PRECOMPILE_HEADERS_REUSE_FROM property is set on target (\"",
          target->GetName(),
          "\"). Reusable precompile headers requires the COMPILE_PDB_NAME"
          " property to have the value \"",
          reuseFrom, "\"\n");
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e,
                                               target->GetBacktrace());
        failed = true;
      }
    }
  }
  return failed;
}